

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O0

void __thiscall QMdiAreaTabBar::mousePressEvent(QMdiAreaTabBar *this,QMouseEvent *event)

{
  long lVar1;
  MouseButton MVar2;
  int __fd;
  QPoint this_00;
  QWidget *this_01;
  QPointF *in_RSI;
  QPoint *in_RDI;
  long in_FS_OFFSET;
  QPointF QVar3;
  QMdiSubWindow *subWindow;
  undefined1 in_stack_ffffffffffffffe0 [16];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MVar2 = QSinglePointEvent::button((QSinglePointEvent *)in_RSI);
  if (MVar2 == MiddleButton) {
    QVar3 = QSinglePointEvent::position((QSinglePointEvent *)0x60da84);
    this_00 = QPointF::toPoint(in_RSI);
    __fd = QTabBar::tabAt((QTabBar *)QVar3.xp,in_RDI);
    this_01 = &subWindowFromIndex((QMdiAreaTabBar *)this_00,QVar3.yp._4_4_)->super_QWidget;
    if (this_01 == (QWidget *)0x0) {
      QEvent::ignore((QEvent *)in_RSI);
    }
    else {
      QWidget::close(this_01,__fd);
    }
  }
  else {
    QTabBar::mousePressEvent(in_stack_ffffffffffffffe0._8_8_,in_stack_ffffffffffffffe0._0_8_);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiAreaTabBar::mousePressEvent(QMouseEvent *event)
{
    if (event->button() != Qt::MiddleButton) {
        QTabBar::mousePressEvent(event);
        return;
    }

    QMdiSubWindow *subWindow = subWindowFromIndex(tabAt(event->position().toPoint()));
    if (!subWindow) {
        event->ignore();
        return;
    }

    subWindow->close();
}